

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

BasicTimeZone * __thiscall icu_63::Calendar::getBasicTimeZone(Calendar *this)

{
  TimeZone *pTVar1;
  long lVar2;
  
  pTVar1 = this->fZone;
  if (pTVar1 != (TimeZone *)0x0) {
    lVar2 = __dynamic_cast(pTVar1,&TimeZone::typeinfo,&OlsonTimeZone::typeinfo,0);
    if (lVar2 != 0) {
      return (BasicTimeZone *)pTVar1;
    }
    if (pTVar1 != (TimeZone *)0x0) {
      lVar2 = __dynamic_cast(pTVar1,&TimeZone::typeinfo,&SimpleTimeZone::typeinfo,0);
      if (lVar2 != 0) {
        return (BasicTimeZone *)pTVar1;
      }
      if (pTVar1 != (TimeZone *)0x0) {
        lVar2 = __dynamic_cast(pTVar1,&TimeZone::typeinfo,&RuleBasedTimeZone::typeinfo,0);
        if (lVar2 != 0) {
          return (BasicTimeZone *)pTVar1;
        }
        if (pTVar1 != (TimeZone *)0x0) {
          lVar2 = __dynamic_cast(pTVar1,&TimeZone::typeinfo,&VTimeZone::typeinfo,0);
          if (lVar2 != 0) {
            return (BasicTimeZone *)pTVar1;
          }
          return (BasicTimeZone *)0x0;
        }
      }
    }
  }
  return (BasicTimeZone *)0x0;
}

Assistant:

BasicTimeZone*
Calendar::getBasicTimeZone(void) const {
    if (dynamic_cast<const OlsonTimeZone *>(fZone) != NULL
        || dynamic_cast<const SimpleTimeZone *>(fZone) != NULL
        || dynamic_cast<const RuleBasedTimeZone *>(fZone) != NULL
        || dynamic_cast<const VTimeZone *>(fZone) != NULL) {
        return (BasicTimeZone*)fZone;
    }
    return NULL;
}